

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall kratos::ActiveVisitor::visit(ActiveVisitor *this,IfStmt *stmt)

{
  iterator iVar1;
  mapped_type *pmVar2;
  VarException *pVVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<const_kratos::IRNode_*> __l_02;
  initializer_list<const_kratos::IRNode_*> __l_03;
  initializer_list<const_kratos::IRNode_*> __l_04;
  undefined1 local_e0 [8];
  shared_ptr<kratos::Var> predicate;
  undefined1 local_b8 [8];
  shared_ptr<kratos::Port> port_s;
  string local_88;
  undefined1 local_68 [8];
  element_type *port;
  undefined1 local_58 [8];
  shared_ptr<kratos::Port> port_1;
  allocator_type local_21;
  
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_e0,
             &(stmt->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  if (*(VarType *)((long)local_e0 + 0x168) == Expression) {
    Var::as<kratos::Expr>((Var *)local_b8);
    if ((*(ulong *)((long)local_b8 + 0x270) & 0xfffffffffffffffb) == 0) {
      Var::as<kratos::Var>((Var *)local_68);
      if (((Var *)local_68)->type_ == PortIO) {
        Var::as<kratos::Port>((Var *)local_58);
        if (*(PortType *)((long)local_58 + 0x274) == Reset) {
          local_88._M_dataplus._M_p = (pointer)local_58;
          iVar1 = std::
                  _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->reset_map_)._M_h,(key_type *)&local_88);
          if (iVar1.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur !=
              (__node_type *)0x0) {
            pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
            (*(((Var *)local_58)->super_IRNode)._vptr_IRNode[0x1f])
                      (&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                 port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            bVar4 = fmt::v7::to_string_view<char,_0>
                              ("{0} is synchronous reset but used as async reset");
            format_str_02.data_ = (char *)bVar4.size_;
            format_str_02.size_ = 0xd;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)
                     &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_88,(detail *)bVar4.data_,format_str_02,args_02);
            predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
            get_reset_stmt(this,(Port *)local_58);
            __l_04._M_len = 3;
            __l_04._M_array =
                 (iterator)
                 &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,__l_04,&local_21);
            VarException::VarException
                      (pVVar3,&local_88,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else if (*(PortType *)((long)local_58 + 0x274) == AsyncReset) {
          local_88._M_dataplus._M_p = (pointer)local_58;
          iVar1 = std::
                  _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->reset_map_)._M_h,(key_type *)&local_88);
          if (iVar1.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur ==
              (__node_type *)0x0) {
            pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
            (*(((Var *)local_58)->super_IRNode)._vptr_IRNode[0x1f])
                      (&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                 port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            bVar4 = fmt::v7::to_string_view<char,_0>("{0} is used has a synchronous reset");
            format_str_01.data_ = (char *)bVar4.size_;
            format_str_01.size_ = 0xd;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)
                     &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_88,(detail *)bVar4.data_,format_str_01,args_01);
            predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
            __l_03._M_len = 2;
            __l_03._M_array =
                 (iterator)
                 &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,__l_03,&local_21);
            VarException::VarException
                      (pVVar3,&local_88,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
          local_88._M_dataplus._M_p = (pointer)local_58;
          pmVar2 = std::__detail::
                   _Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->reset_map_,(key_type *)&local_88);
          if (*pmVar2 == true) {
            pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_88,"Active high signal used as active low",
                       (allocator<char> *)
                       &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
            __l_00._M_len = 2;
            __l_00._M_array =
                 (iterator)
                 &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,__l_00,&local_21);
            VarException::VarException
                      (pVVar3,&local_88,
                       (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                       &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port_1);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
    }
  }
  else {
    if (*(VarType *)((long)local_e0 + 0x168) != PortIO) goto LAB_001f2f3e;
    Var::as<kratos::Port>((Var *)local_b8);
    local_68 = local_b8;
    if (*(PortType *)((long)local_b8 + 0x274) == Reset) {
      iVar1 = std::
              _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->reset_map_)._M_h,(key_type *)local_68);
      if (iVar1.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur !=
          (__node_type *)0x0) {
        pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
        (*(((Var *)local_68)->super_IRNode)._vptr_IRNode[0x1f])
                  (&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        bVar4 = fmt::v7::to_string_view<char,_0>("{0} is synchronous reset but used as async reset")
        ;
        format_str.data_ = (char *)bVar4.size_;
        format_str.size_ = 0xd;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)
                 &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar4.data_,format_str,args);
        predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68;
        get_reset_stmt(this,(Port *)local_68);
        __l_01._M_len = 3;
        __l_01._M_array =
             (iterator)
             &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   __l_01,(allocator_type *)local_58);
        VarException::VarException
                  (pVVar3,&local_88,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if (*(PortType *)((long)local_b8 + 0x274) == AsyncReset) {
      iVar1 = std::
              _Hashtable<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->reset_map_)._M_h,(key_type *)local_68);
      if (iVar1.super__Node_iterator_base<std::pair<kratos::Port_*const,_bool>,_false>._M_cur ==
          (__node_type *)0x0) {
        pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
        (*(((Var *)local_68)->super_IRNode)._vptr_IRNode[0x1f])
                  (&port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        bVar4 = fmt::v7::to_string_view<char,_0>("{0} is used has a synchronous reset");
        format_str_00.data_ = (char *)bVar4.size_;
        format_str_00.size_ = 0xd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)
                 &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar4.data_,format_str_00,args_00);
        predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68;
        __l_02._M_len = 2;
        __l_02._M_array =
             (iterator)
             &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   __l_02,(allocator_type *)local_58);
        VarException::VarException
                  (pVVar3,&local_88,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      pmVar2 = std::__detail::
               _Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<kratos::Port_*,_std::pair<kratos::Port_*const,_bool>,_std::allocator<std::pair<kratos::Port_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Port_*>,_std::hash<kratos::Port_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->reset_map_,(key_type *)local_68);
      if (*pmVar2 == false) {
        pVVar3 = (VarException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Active low signal used as active high",
                   (allocator<char> *)
                   &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68;
        __l._M_len = 2;
        __l._M_array = (iterator)
                       &port_1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   __l,(allocator_type *)local_58);
        VarException::VarException
                  (pVVar3,&local_88,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &port_s.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        __cxa_throw(pVVar3,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port_s);
LAB_001f2f3e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&predicate);
  return;
}

Assistant:

void visit(IfStmt* stmt) override {
        auto predicate = stmt->predicate();
        // notice this just catch some simple mistakes
        // thus is designed to be zero false negative
        if (predicate->type() == VarType::PortIO) {
            auto port_s = predicate->as<Port>();
            auto* port = port_s.get();
            if (port->port_type() == PortType::AsyncReset) {
                if (reset_map_.find(port) == reset_map_.end()) {
                    // it's used as a sync reset
                    throw VarException(
                        ::format("{0} is used has a synchronous reset", port->to_string()),
                        {port, stmt});
                }
                bool reset_high = reset_map_.at(port);
                if (!reset_high)
                    throw VarException("Active low signal used as active high", {port, stmt});
            } else if (port->port_type() == PortType::Reset) {
                if (reset_map_.find(port) != reset_map_.end()) {
                    throw VarException(::format("{0} is synchronous reset but used as async reset",
                                                port->to_string()),
                                       {port, stmt, get_reset_stmt(port)});
                }
            }
        } else if (predicate->type() == VarType::Expression) {
            auto expr = predicate->as<Expr>();
            if (expr->op == ExprOp::UNot || expr->op == ExprOp::UInvert) {
                auto var = expr->left->as<Var>();
                if (var->type() == VarType::PortIO) {
                    auto port = var->as<Port>();
                    if (port->port_type() == PortType::AsyncReset) {
                        if (reset_map_.find(port.get()) == reset_map_.end()) {
                            // it's used as a sync reset
                            throw VarException(
                                ::format("{0} is used has a synchronous reset", port->to_string()),
                                {port.get(), stmt});
                        }
                        bool reset_high = reset_map_.at(port.get());
                        if (reset_high) {
                            throw VarException("Active high signal used as active low",
                                               {port.get(), stmt});
                        }
                    } else if (port->port_type() == PortType::Reset) {
                        if (reset_map_.find(port.get()) != reset_map_.end()) {
                            throw VarException(
                                ::format("{0} is synchronous reset but used as async reset",
                                         port->to_string()),
                                {port.get(), stmt, get_reset_stmt(port.get())});
                        }
                    }
                }
            }
        }
    }